

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O3

void rr::resolveMultisampleStencilBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int iVar1;
  int z;
  int iVar2;
  ConstPixelBufferAccess effectiveSrc;
  PixelBufferAccess effectiveDst;
  ConstPixelBufferAccess local_c8;
  PixelBufferAccess local_a0;
  MultisampleConstPixelBufferAccess local_78;
  ConstPixelBufferAccess local_50;
  
  tcu::getEffectiveDepthStencilAccess(&local_c8,&src->m_access,MODE_STENCIL);
  tcu::getEffectiveDepthStencilAccess(&local_a0,dst,MODE_STENCIL);
  if ((src->m_access).m_size.m_data[0] == 1) {
    local_78.m_access.m_format = local_c8.m_format;
    local_78.m_access.m_size.m_data[0] = local_c8.m_size.m_data[0];
    local_78.m_access.m_size.m_data[1] = local_c8.m_size.m_data[1];
    local_78.m_access.m_size.m_data[2] = local_c8.m_size.m_data[2];
    local_78.m_access.m_pitch.m_data[0] = local_c8.m_pitch.m_data[0];
    local_78.m_access.m_pitch.m_data[1] = local_c8.m_pitch.m_data[1];
    local_78.m_access.m_pitch.m_data[2] = local_c8.m_pitch.m_data[2];
    local_78.m_access.m_data = local_c8.m_data;
    MultisampleConstPixelBufferAccess::toSinglesampleAccess(&local_50,&local_78);
    tcu::copy((EVP_PKEY_CTX *)&local_a0,(EVP_PKEY_CTX *)&local_50);
  }
  else {
    iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
    if (0 < iVar2) {
      iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
      z = 0;
      do {
        if (0 < iVar1) {
          iVar2 = 0;
          do {
            iVar1 = tcu::ConstPixelBufferAccess::getPixStencil(&local_c8,0,iVar2,z);
            tcu::PixelBufferAccess::setPixStencil(&local_a0,iVar1,iVar2,z,0);
            iVar2 = iVar2 + 1;
            iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
          } while (iVar2 < iVar1);
          iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
        }
        z = z + 1;
      } while (z < iVar2);
    }
  }
  return;
}

Assistant:

void resolveMultisampleStencilBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	const tcu::ConstPixelBufferAccess	effectiveSrc = tcu::getEffectiveDepthStencilAccess(src.raw(), tcu::Sampler::MODE_STENCIL);
	const tcu::PixelBufferAccess		effectiveDst = tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_STENCIL);

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(effectiveDst, MultisampleConstPixelBufferAccess::fromMultisampleAccess(effectiveSrc).toSinglesampleAccess());
	}
	else
	{
		// Resolve by selecting one
		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
			effectiveDst.setPixStencil(effectiveSrc.getPixStencil(0, x, y), x, y);
	}
}